

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int s_mp_sqr(mp_int *a,mp_int *b)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  mp_int *in_RSI;
  int *in_RDI;
  mp_digit *tmpt;
  mp_digit tmpx;
  mp_digit u;
  mp_word r;
  int pa;
  int iy;
  int ix;
  int res;
  mp_int t;
  mp_int *in_stack_ffffffffffffff88;
  mp_int *in_stack_ffffffffffffff90;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  int local_3c;
  int local_38;
  mp_int local_30;
  mp_int *local_18;
  int *local_10;
  int local_4;
  
  iVar1 = *in_RDI;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_4 = mp_init_size(in_stack_ffffffffffffff88,0);
  if (local_4 == 0) {
    local_30.used = iVar1 * 2 + 1;
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      uVar11 = *(ulong *)(*(long *)(local_10 + 4) + (long)local_38 * 8);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar11;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar11;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_30.dp[local_38 * 2];
      auVar6 = auVar2 * auVar4 + auVar6;
      local_58 = auVar6._0_8_;
      local_30.dp[local_38 * 2] = local_58 & 0xfffffffffffffff;
      local_50 = auVar6._8_8_;
      local_60 = local_50 << 4 | local_58 >> 0x3c;
      uVar11 = *(ulong *)(*(long *)(local_10 + 4) + (long)local_38 * 8);
      in_stack_ffffffffffffff90 = (mp_int *)(local_30.dp + (local_38 * 2 + 1));
      local_3c = local_38;
      while (local_3c = local_3c + 1, local_3c < iVar1) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar11;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *(ulong *)(*(long *)(local_10 + 4) + (long)local_3c * 8);
        local_58 = SUB168(auVar3 * auVar5,0);
        local_50 = SUB168(auVar3 * auVar5,8);
        uVar7 = *(ulong *)in_stack_ffffffffffffff90 + local_58;
        uVar8 = uVar7 + local_58;
        uVar9 = uVar8 + local_60;
        uVar10 = uVar9 & 0xfffffffffffffff;
        in_stack_ffffffffffffff90->used = (int)uVar10;
        in_stack_ffffffffffffff90->alloc = (int)(uVar10 >> 0x20);
        local_60 = (local_50 * 2 + (ulong)CARRY8(*(ulong *)in_stack_ffffffffffffff90,local_58) +
                    (ulong)CARRY8(uVar7,local_58) + (ulong)CARRY8(uVar8,local_60)) * 0x10 |
                   uVar9 >> 0x3c;
        in_stack_ffffffffffffff90 = (mp_int *)&in_stack_ffffffffffffff90->sign;
      }
      while (local_60 != 0) {
        uVar11 = *(ulong *)in_stack_ffffffffffffff90 + local_60;
        uVar7 = uVar11 & 0xfffffffffffffff;
        in_stack_ffffffffffffff90->used = (int)uVar7;
        in_stack_ffffffffffffff90->alloc = (int)(uVar7 >> 0x20);
        local_50 = (ulong)CARRY8(*(ulong *)in_stack_ffffffffffffff90,local_60);
        in_stack_ffffffffffffff90 = (mp_int *)&in_stack_ffffffffffffff90->sign;
        local_60 = local_50 << 4 | uVar11 >> 0x3c;
      }
    }
    mp_clamp(&local_30);
    mp_exch(&local_30,local_18);
    mp_clear(in_stack_ffffffffffffff90);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int s_mp_sqr (mp_int * a, mp_int * b)
{
  mp_int  t;
  int     res, ix, iy, pa;
  mp_word r;
  mp_digit u, tmpx, *tmpt;

  pa = a->used;
  if ((res = mp_init_size (&t, 2*pa + 1)) != MP_OKAY) {
    return res;
  }

  /* default used is maximum possible size */
  t.used = 2*pa + 1;

  for (ix = 0; ix < pa; ix++) {
    /* first calculate the digit at 2*ix */
    /* calculate double precision result */
    r = ((mp_word) t.dp[2*ix]) +
        ((mp_word)a->dp[ix])*((mp_word)a->dp[ix]);

    /* store lower part in result */
    t.dp[ix+ix] = (mp_digit) (r & ((mp_word) MP_MASK));

    /* get the carry */
    u           = (mp_digit)(r >> ((mp_word) DIGIT_BIT));

    /* left hand side of A[ix] * A[iy] */
    tmpx        = a->dp[ix];

    /* alias for where to store the results */
    tmpt        = t.dp + (2*ix + 1);
    
    for (iy = ix + 1; iy < pa; iy++) {
      /* first calculate the product */
      r       = ((mp_word)tmpx) * ((mp_word)a->dp[iy]);

      /* now calculate the double precision result, note we use
       * addition instead of *2 since it's easier to optimize
       */
      r       = ((mp_word) *tmpt) + r + r + ((mp_word) u);

      /* store lower part */
      *tmpt++ = (mp_digit) (r & ((mp_word) MP_MASK));

      /* get carry */
      u       = (mp_digit)(r >> ((mp_word) DIGIT_BIT));
    }
    /* propagate upwards */
    while (u != ((mp_digit) 0)) {
      r       = ((mp_word) *tmpt) + ((mp_word) u);
      *tmpt++ = (mp_digit) (r & ((mp_word) MP_MASK));
      u       = (mp_digit)(r >> ((mp_word) DIGIT_BIT));
    }
  }

  mp_clamp (&t);
  mp_exch (&t, b);
  mp_clear (&t);
  return MP_OKAY;
}